

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O0

void socket_select(CMtrans_services_conflict svc,select_data_ptr sd,int timeout_sec,int timeout_usec
                  )

{
  long lVar1;
  timeval now_00;
  FILE *__stream;
  int iVar2;
  pthread_t pVar3;
  periodic_task_handle_conflict p_Var4;
  int *piVar5;
  uint *puVar6;
  int in_ECX;
  int in_EDX;
  pthread_t *in_RSI;
  long in_RDI;
  periodic_task_handle_conflict next;
  timeval now_1;
  periodic_task_handle_conflict this_periodic_task;
  timeval now;
  int tmp_select_consistency_number;
  timeval timeout;
  int ep_timeout;
  epoll_event events [32];
  int fd;
  int res;
  int i;
  FILE *in_stack_fffffffffffffdf8;
  periodic_task_handle_conflict handle;
  __time_t in_stack_fffffffffffffe08;
  select_data_ptr sd_00;
  FunctionListElement *in_stack_fffffffffffffe10;
  long local_1e8;
  select_data_ptr local_1e0;
  timeval local_1d8;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  int local_1ac;
  epoll_event local_1a8 [24];
  uint local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  pthread_t *local_10;
  long local_8;
  
  local_1c4 = (int)in_RSI[7];
  if ((int)in_RSI[5] == 0) {
    local_18 = in_ECX;
    local_14 = in_EDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    if ((in_RSI[6] != 0) &&
       (iVar2 = (**(code **)(in_RDI + 0xb8))
                          (in_RSI[6],
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                           ,0xee), iVar2 == 0)) {
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
             ,0xee,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
    if (*local_10 == 0) {
      pVar3 = pthread_self();
      *local_10 = pVar3;
    }
    handle = (periodic_task_handle_conflict)*local_10;
    p_Var4 = (periodic_task_handle_conflict)pthread_self();
    if (handle != p_Var4) {
      fprintf(_stderr,"Warning:  Multiple threads calling CManager_socket_select.\n");
      fprintf(_stderr,"          This situation may result in unexpected I/O blocking.\n");
      in_stack_fffffffffffffdf8 = _stderr;
      pVar3 = pthread_self();
      fprintf(in_stack_fffffffffffffdf8,"          Server thread set to %lx.\n",pVar3);
      pVar3 = pthread_self();
      *local_10 = pVar3;
    }
    if ((local_14 < 0) && (local_10[4] == 0)) {
      (**(code **)(local_8 + 0x38))(local_10[6],0xc,"CMSelect blocking select");
      (**(code **)(local_8 + 0xa8))
                (local_10[6],
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                 ,0x11e);
      local_20 = epoll_wait((int)local_10[1],local_1a8,0x20,-1);
      (**(code **)(local_8 + 0xb0))
                (local_10[6],
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                 ,0x121);
    }
    else {
      gettimeofday(&local_1d8,(__timezone_ptr_t)0x0);
      if (999999 < local_18) {
        local_14 = local_18 / 1000000 + local_14;
        local_18 = local_18 % 1000000;
      }
      local_1c0 = (long)local_14;
      local_1b8 = (long)local_18;
      now_00.tv_usec = (__suseconds_t)in_stack_fffffffffffffe10;
      now_00.tv_sec = in_stack_fffffffffffffe08;
      set_soonest_timeout((timeval *)handle,(periodic_task_handle_conflict)in_stack_fffffffffffffdf8
                          ,now_00);
      (**(code **)(local_8 + 0x38))
                (local_10[6],0xc,"CMSelect with timeout %d sec, %d usec",local_1c0,local_1b8);
      if (local_1c0 == -1) {
        local_1b8 = 1;
        local_1c0 = 0;
      }
      (**(code **)(local_8 + 0xa8))
                (local_10[6],
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                 ,0x117);
      local_1ac = (int)local_1c0 * 1000 + (int)(local_1b8 / 1000);
      local_20 = epoll_wait((int)local_10[1],local_1a8,0x20,local_1ac);
      (**(code **)(local_8 + 0xb0))
                (local_10[6],
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                 ,0x11b);
    }
    if ((int)local_10[5] == 0) {
      if (local_20 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 == 4) {
          return;
        }
        if ((int)local_10[7] != local_1c4) {
          return;
        }
        piVar5 = __errno_location();
        if (*piVar5 == 0) {
          return;
        }
        piVar5 = __errno_location();
        if (*piVar5 == 9) {
          fprintf(_stderr,"The epoll fd is invalid. This is catastrophic.\n");
        }
        else {
          piVar5 = __errno_location();
          __stream = _stderr;
          if (*piVar5 != 0xb) {
            puVar6 = (uint *)__errno_location();
            fprintf(__stream,"select failed, errno %d\n",(ulong)*puVar6);
            exit(1);
          }
        }
      }
      if ((int)local_10[7] == local_1c4) {
        for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
          if ((int)local_10[5] != 0) {
            *local_10 = 0;
            return;
          }
          local_24 = *(uint *)(&local_1a8[0].field_0x4 + (long)local_1c * 0xc);
          if ((((&local_1a8[0].events)[(long)local_1c * 3] & 1) != 0) &&
             (*(long *)(local_10[2] + (long)(int)local_24 * 0x18) != 0)) {
            (**(code **)(local_8 + 0x38))
                      (local_10[6],0xc,"Running select read action on fd %d",local_24);
            (**(code **)(local_10[2] + (long)(int)local_24 * 0x18))
                      (*(undefined8 *)(local_10[2] + (long)(int)local_24 * 0x18 + 8),
                       *(undefined8 *)(local_10[2] + (long)(int)local_24 * 0x18 + 0x10));
          }
          if ((int)local_10[7] != local_1c4) {
            return;
          }
          if (((&local_1a8[0].events)[(long)local_1c * 3] & 4) != 0) {
            if (*(long *)(local_10[3] + (long)(int)local_24 * 0x18) == 0) {
              fprintf(_stderr,"FD %d is polled, but no write item function.\n",(ulong)local_24);
            }
            else {
              (**(code **)(local_8 + 0x38))
                        (local_10[6],0xc,"Running select write action on fd %d",local_24);
              (**(code **)(local_10[3] + (long)(int)local_24 * 0x18))
                        (*(undefined8 *)(local_10[3] + (long)(int)local_24 * 0x18 + 8),
                         *(undefined8 *)(local_10[3] + (long)(int)local_24 * 0x18 + 0x10));
            }
          }
          if ((int)local_10[7] != local_1c4) {
            return;
          }
        }
        if (local_10[4] == 0) {
LAB_00102c2e:
          *(int *)(local_10 + 7) = (int)local_10[7] + 1;
        }
        else {
          local_1e0 = (select_data_ptr)local_10[4];
          gettimeofday((timeval *)&stack0xfffffffffffffe10,(__timezone_ptr_t)0x0);
          do {
            if (local_1e0 == (select_data_ptr)0x0) goto LAB_00102c2e;
            sd_00 = *(select_data_ptr *)&local_1e0->select_consistency_number;
            if (((long)local_1e0->select_items < (long)in_stack_fffffffffffffe10) ||
               ((in_stack_fffffffffffffe10 == local_1e0->select_items &&
                ((long)local_1e0->write_items < local_1e8)))) {
              increment_time((timeval *)&local_1e0->select_items,(int)local_1e0->server_thread,
                             *(int *)((long)&local_1e0->server_thread + 4));
              lVar1._0_4_ = local_1e0->epfd;
              lVar1._4_4_ = local_1e0->sel_item_max;
              if (lVar1 == -1) {
                pVar3 = pthread_self();
                local_1e0->epfd = (int)pVar3;
                local_1e0->sel_item_max = (int)(pVar3 >> 0x20);
                (**(code **)(local_8 + 0xa8))
                          (local_10[6],
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                           ,0x1b3);
                (*(code *)local_1e0->periodic_task_list)
                          (*(undefined8 *)&local_1e0->closed,local_1e0->cm);
                (**(code **)(local_8 + 0xb0))
                          (local_10[6],
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                           ,0x1b6);
                sd_00 = *(select_data_ptr *)&local_1e0->select_consistency_number;
                local_1e0->epfd = -1;
                local_1e0->sel_item_max = -1;
                if (((int)local_1e0->server_thread == 0) &&
                   (*(int *)((long)&local_1e0->server_thread + 4) == 0)) {
                  remove_periodic_task(sd_00,handle);
                }
              }
              if ((int)local_10[5] != 0) {
                shutdown_wake_mechanism((select_data_ptr)0x102c06);
                return;
              }
            }
            local_1e0 = sd_00;
          } while ((int)local_10[7] == local_1c4);
        }
      }
    }
    else {
      *local_10 = 0;
    }
  }
  else {
    *in_RSI = 0;
  }
  return;
}

Assistant:

static void
socket_select(CMtrans_services svc, select_data_ptr sd, int timeout_sec, int timeout_usec)
{
    int i, res;
    int fd;
    struct epoll_event events[MAX_EVENTS];
    int ep_timeout;

    struct timeval timeout;
    int tmp_select_consistency_number = sd->select_consistency_number;

    if (sd->closed) {
	sd->server_thread =  (thr_thread_t) NULL; 
	return;
    }

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    if (sd->server_thread ==  (thr_thread_t) NULL) {
	/* no server thread set, must be this one */
	sd->server_thread = thr_thread_self();
    }
    if (sd->server_thread != thr_thread_self()) {
	/* What?  We're polling, but we're not the server thread? */
	fprintf(stderr, "Warning:  Multiple threads calling CManager_socket_select.\n");
	fprintf(stderr, "          This situation may result in unexpected I/O blocking.\n");
	fprintf(stderr, "          Server thread set to %lx.\n", (long) thr_thread_self());
	sd->server_thread = thr_thread_self();
    }
    if ((timeout_sec >= 0) || (sd->periodic_task_list != NULL)) {
	struct timeval now;
#ifndef HAVE_WINDOWS_H
	gettimeofday(&now, NULL);
#else
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
	struct _timeb nowb;
	_ftime(&nowb);
	now.tv_sec = nowb.time;
	now.tv_usec = nowb.millitm * 1000;
#endif
	if (timeout_usec >= 1000000) {
	    timeout_sec += (timeout_usec / 1000000);
	    timeout_usec = timeout_usec % 1000000;
	}
	timeout.tv_sec = timeout_sec;
	timeout.tv_usec = timeout_usec;
	
	set_soonest_timeout(&timeout, sd->periodic_task_list, now);
        svc->verbose(sd->cm, CMSelectVerbose, "CMSelect with timeout %d sec, %d usec", 
		       timeout.tv_sec, timeout.tv_usec);

	if (timeout.tv_sec == -1) {
	    timeout.tv_usec = 1;
	    timeout.tv_sec = 0;
	}
	DROP_CM_LOCK(svc, sd->cm);
	ep_timeout = (1000 * timeout.tv_sec) + (timeout.tv_usec / 1000);
        res = epoll_wait(sd->epfd, events, MAX_EVENTS, ep_timeout);

	ACQUIRE_CM_LOCK(svc, sd->cm);
    } else {
	svc->verbose(sd->cm, CMSelectVerbose, "CMSelect blocking select");
	DROP_CM_LOCK(svc, sd->cm);
	res = epoll_wait(sd->epfd, events, MAX_EVENTS, -1);

	ACQUIRE_CM_LOCK(svc, sd->cm);
    }
    if (sd->closed) {
	sd->server_thread =  (thr_thread_t) NULL; 
	return;
    }
#ifndef HAVE_WINDOWS_H
    if (res == -1) {
	if (errno == EINTR) {
	    return;
	}
	/* 
	 * if upon returning from select the consistency number
	 * has changed, the only safe thing to do is return so 
	 * that a new select can happen with consistent info.
	 */
	if (sd->select_consistency_number != 
	    tmp_select_consistency_number) return;
	if (errno == 0) {
	    /* 
	     * odd, but x86 Solaris seems to return -1 from select but not set
	     * the errno in some circumstances.  Just return when this happens.
	     */
	    return;
	}
	if (errno == EBADF) {
	    fprintf(stderr, "The epoll fd is invalid. This is catastrophic.\n");
	} else if (errno != EAGAIN) {
#ifdef HAVE_FDS_BITS
	    fprintf(stderr, "select failed, errno %d, rd_set was %lx, %lx,%lx, %lx\n\n", errno,
		    (long) ((fd_set *) sd->fdset)->fds_bits[0],
		    (long) ((fd_set *) sd->fdset)->fds_bits[1],
		    (long) ((fd_set *) sd->fdset)->fds_bits[2],
		    (long) ((fd_set *) sd->fdset)->fds_bits[3]);
	    fprintf(stderr, "timeout was %d and %d\n", timeout_sec, timeout_usec);
#else
	    fprintf(stderr, "select failed, errno %d\n", errno);
#endif
	    exit(1);
	    return;
	}
    }
#else
    /* 
     * Have to ignore the bad invalue for select on NT because it can't
     * do selects on files.  Otherwise you will get a bunch of
     * irritating select errors that aren't really errors 
     */
    if (res == SOCKET_ERROR) {
	int errno_val;
	errno_val = WSAGetLastError();
	if (errno_val == WSAEINTR || errno_val == WSAEINVAL) {
	    return;
	} else {
	    fprintf(stderr, "select failed, errno %d\n", 
		    WSAerror_str(errno_val));
	}
	return;
    }
#endif

#ifdef HAVE_FDS_BITS
    svc->verbose(sd->cm, CMSelectVerbose, "select returned, rd_set started %lx, %lx, %lx, %lx, result was %lx, %lx, %lx, %lx",
	    (long) ((fd_set *) sd->fdset)->fds_bits[0],
	    (long) ((fd_set *) sd->fdset)->fds_bits[1],
	    (long) ((fd_set *) sd->fdset)->fds_bits[2],
	    (long) ((fd_set *) sd->fdset)->fds_bits[3],
	    (long) ((fd_set *) &rd_set)->fds_bits[0],
	    (long) ((fd_set *) &rd_set)->fds_bits[1],
	    (long) ((fd_set *) &rd_set)->fds_bits[2],
	    (long) ((fd_set *) &rd_set)->fds_bits[3]);
    svc->verbose(sd->cm, CMSelectVerbose, "       write_set started %lx, %lx, %lx, %lx, result was %lx, %lx, %lx, %lx",
	    (long) ((fd_set *) sd->write_set)->fds_bits[0],
	    (long) ((fd_set *) sd->write_set)->fds_bits[1],
	    (long) ((fd_set *) sd->write_set)->fds_bits[2],
	    (long) ((fd_set *) sd->write_set)->fds_bits[3],
	    (long) ((fd_set *) &wr_set)->fds_bits[0],
	    (long) ((fd_set *) &wr_set)->fds_bits[1],
	    (long) ((fd_set *) &wr_set)->fds_bits[2],
	    (long) ((fd_set *) &wr_set)->fds_bits[3]);
#endif
    /* 
     * if upon returning from select the consistency number
     * has changed, the only safe thing to do is return so 
     * that a new select can happen with consistent info.
     */
    if (sd->select_consistency_number != 
	tmp_select_consistency_number) return;
    /* 
     * Careful!  We're reading the control list here without locking!
     * Something bad *might* happen, it's just unlikely.
     */
    for(i = 0; i < res; i++) {
    	if (sd->closed) {
    		sd->server_thread =  (thr_thread_t) NULL;
    		return;
    	}
    	fd = events[i].data.fd;
    	if(events[i].events & EPOLLIN) {
    		if(sd->select_items[fd].func != NULL) {
    			svc->verbose(sd->cm, CMSelectVerbose,
    				"Running select read action on fd %d", fd);
    			sd->select_items[fd].func(sd->select_items[fd].arg1,
    				sd->select_items[fd].arg2);
    		}
    	}
    	if (sd->select_consistency_number !=
    		tmp_select_consistency_number) return;
    	if(events[i].events & EPOLLOUT) {
    		if(sd->write_items[fd].func != NULL) {
    			svc->verbose(sd->cm, CMSelectVerbose,
    					"Running select write action on fd %d", fd);
    			sd->write_items[fd].func(sd->write_items[fd].arg1,
    				sd->write_items[fd].arg2);
    		} else {
    			fprintf(stderr, "FD %d is polled, but no write item function.\n", fd);
    		}
    	}
    	if (sd->select_consistency_number !=
    		tmp_select_consistency_number) return;
    }

    if (sd->periodic_task_list != NULL) {
	/* handle periodic tasks */
	periodic_task_handle this_periodic_task = sd->periodic_task_list;
	struct timeval now;

#ifndef HAVE_WINDOWS_H
	gettimeofday(&now, NULL);
#else
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
	struct _timeb nowb;
	_ftime(&nowb);
	now.tv_sec = nowb.time;
	now.tv_usec = nowb.millitm * 1000;
#endif
	while (this_periodic_task != NULL ) {
	    periodic_task_handle next = this_periodic_task->next;
	    if (timercmp(&now, &this_periodic_task->next_time, >)) {
		increment_time(&this_periodic_task->next_time,
			       this_periodic_task->period_sec,
			       this_periodic_task->period_usec);
		if (this_periodic_task->executing == (thr_thread_t)-1) {
		    this_periodic_task->executing = thr_thread_self();
		    DROP_CM_LOCK(svc, sd->cm);
		    this_periodic_task->func(this_periodic_task->arg1,
					     this_periodic_task->arg2);
		    ACQUIRE_CM_LOCK(svc, sd->cm);
		    next = this_periodic_task->next;
		    this_periodic_task->executing = (thr_thread_t) -1;
		    if ((this_periodic_task->period_sec == 0) &&
			(this_periodic_task->period_usec == 0)) {
		        remove_periodic_task(sd, this_periodic_task);
		    }
		}
		if (sd->closed) {
		    shutdown_wake_mechanism(sd);
		    return;
		}
	    }
	    /* 
	     * if upon returning from a handler the consistency number
	     * has changed, the only safe thing to do is return so 
	     * that a new select can happen with consistent info.
	     */
	    if (sd->select_consistency_number != 
		tmp_select_consistency_number) return;
	    this_periodic_task = next;
	}
    }
    sd->select_consistency_number++;
}